

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControl::insertFromMimeData(QWidgetTextControl *this,QMimeData *source)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  QWidgetTextControlPrivate *pQVar4;
  qsizetype qVar5;
  ulong uVar6;
  QStringBuilder<QLatin1String,_QString> *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool hasData;
  QWidgetTextControlPrivate *d;
  QString text;
  QString richtext;
  QString s;
  QStringList formats;
  QTextDocumentFragment fragment;
  undefined8 in_stack_fffffffffffffdd8;
  MarkdownFeature flags;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  QString *in_stack_fffffffffffffde8;
  QStringBuilder<QLatin1String,_QString> *a;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  byte bVar7;
  byte bVar8;
  bool local_1f1;
  undefined7 in_stack_fffffffffffffe18;
  byte bVar9;
  QTextDocumentFragment local_190 [8];
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  QTextDocument local_170 [24];
  QTextDocumentFragment local_158 [8];
  QTextDocumentFragment local_150 [32];
  undefined1 local_130 [48];
  QLatin1StringView local_100;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 local_b0 [32];
  QTextDocumentFragment local_90 [32];
  undefined1 local_70 [24];
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QLatin1StringView local_40;
  QList<QString> local_30;
  undefined1 *local_18;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_c;
  long local_8;
  
  flags = (MarkdownFeature)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QWidgetTextControl *)0x71e38e);
  local_c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)
                  CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),flags);
  bVar1 = QFlags<Qt::TextInteractionFlag>::operator!((QFlags<Qt::TextInteractionFlag> *)&local_c);
  bVar9 = 1;
  if (!bVar1) {
    bVar9 = in_RSI != (QStringBuilder<QLatin1String,_QString> *)0x0 ^ 0xff;
  }
  if ((bVar9 & 1) == 0) {
    bVar1 = false;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocumentFragment::QTextDocumentFragment((QTextDocumentFragment *)&local_18);
    local_30.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)((in_RSI->a).m_size + 0x68))(&local_30);
    qVar5 = QList<QString>::size(&local_30);
    local_1f1 = false;
    if (qVar5 != 0) {
      QList<QString>::first
                ((QList<QString> *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
      local_40 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffde8,
                            CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
      local_1f1 = ::operator==(in_stack_fffffffffffffde8,
                               (QLatin1StringView *)
                               CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    }
    if (local_1f1 == false) {
      a = in_RSI;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_RSI,CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
      latin1_00.m_data._0_7_ = in_stack_fffffffffffffe18;
      latin1_00.m_size = (qsizetype)in_RDI;
      latin1_00.m_data._7_1_ = bVar9;
      QString::QString((QString *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                       latin1_00);
      uVar3 = (**(code **)((a->a).m_size + 0x60))(a,local_b0);
      bVar7 = 0;
      if ((uVar3 & 1) != 0) {
        bVar7 = pQVar4->acceptRichText;
      }
      bVar8 = bVar7;
      QString::~QString((QString *)0x71e66b);
      if ((bVar7 & 1) == 0) {
        uVar6 = QMimeData::hasHtml();
        if (((uVar6 & 1) != 0) && ((pQVar4->acceptRichText & 1U) != 0)) {
          QMimeData::html();
          QTextDocumentFragment::fromHtml((QString *)local_158,local_170);
          QTextDocumentFragment::operator=((QTextDocumentFragment *)&local_18,local_158);
          QTextDocumentFragment::~QTextDocumentFragment(local_158);
          QString::~QString((QString *)0x71e87b);
          bVar1 = true;
        }
      }
      else {
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        local_c0 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8 = &DAT_aaaaaaaaaaaaaaaa;
        local_100 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)a,CONCAT17(bVar7,in_stack_fffffffffffffde0));
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)a,CONCAT17(bVar7,in_stack_fffffffffffffde0));
        latin1_01.m_data._0_7_ = in_stack_fffffffffffffe18;
        latin1_01.m_size = (qsizetype)in_RDI;
        latin1_01.m_data._7_1_ = bVar9;
        QString::QString((QString *)CONCAT17(bVar8,in_stack_fffffffffffffdf0),latin1_01);
        QMimeData::data((QString *)local_130);
        QString::fromUtf8<void>((QByteArray *)CONCAT17(bVar7,in_stack_fffffffffffffde0));
        ::operator+(&a->a,(QString *)CONCAT17(bVar7,in_stack_fffffffffffffde0));
        ::QStringBuilder::operator_cast_to_QString(in_RSI);
        QStringBuilder<QLatin1String,_QString>::~QStringBuilder
                  ((QStringBuilder<QLatin1String,_QString> *)0x71e771);
        QString::~QString((QString *)0x71e77e);
        QByteArray::~QByteArray((QByteArray *)0x71e78b);
        QString::~QString((QString *)0x71e798);
        QTextDocumentFragment::fromHtml((QString *)local_150,(QTextDocument *)&local_c8);
        QTextDocumentFragment::operator=((QTextDocumentFragment *)&local_18,local_150);
        QTextDocumentFragment::~QTextDocumentFragment(local_150);
        bVar1 = true;
        QString::~QString((QString *)0x71e7ed);
      }
    }
    else {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffde8,
                 CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
      latin1.m_data._0_7_ = in_stack_fffffffffffffe18;
      latin1.m_size = (qsizetype)in_RDI;
      latin1.m_data._7_1_ = bVar9;
      QString::QString((QString *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                       latin1);
      QMimeData::data((QString *)local_70);
      QString::fromUtf8<void>
                ((QByteArray *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
      QByteArray::~QByteArray((QByteArray *)0x71e56f);
      QString::~QString((QString *)0x71e57c);
      QFlags<QTextDocument::MarkdownFeature>::QFlags
                ((QFlags<QTextDocument::MarkdownFeature> *)
                 CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),flags);
      QTextDocumentFragment::fromMarkdown((QString *)local_90,(QFlags_conflict1 *)&local_58);
      QTextDocumentFragment::operator=((QTextDocumentFragment *)&local_18,local_90);
      QTextDocumentFragment::~QTextDocumentFragment(local_90);
      bVar1 = true;
      QString::~QString((QString *)0x71e5de);
    }
    if (!bVar1) {
      local_188 = &DAT_aaaaaaaaaaaaaaaa;
      local_180 = &DAT_aaaaaaaaaaaaaaaa;
      local_178 = &DAT_aaaaaaaaaaaaaaaa;
      QMimeData::text();
      bVar2 = QString::isNull((QString *)0x71e8de);
      if (!bVar2) {
        QTextDocumentFragment::fromPlainText((QString *)local_190);
        QTextDocumentFragment::operator=((QTextDocumentFragment *)&local_18,local_190);
        QTextDocumentFragment::~QTextDocumentFragment(local_190);
        bVar1 = true;
      }
      QString::~QString((QString *)0x71e92b);
    }
    if (bVar1) {
      QTextCursor::insertFragment((QTextDocumentFragment *)&pQVar4->cursor);
    }
    (**(code **)(*in_RDI + 0x60))();
    QList<QString>::~QList((QList<QString> *)0x71e966);
    QTextDocumentFragment::~QTextDocumentFragment((QTextDocumentFragment *)&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControl::insertFromMimeData(const QMimeData *source)
{
    Q_D(QWidgetTextControl);
    if (!(d->interactionFlags & Qt::TextEditable) || !source)
        return;

    bool hasData = false;
    QTextDocumentFragment fragment;
#if QT_CONFIG(textmarkdownreader)
    const auto formats = source->formats();
    if (formats.size() && formats.first() == "text/markdown"_L1) {
        auto s = QString::fromUtf8(source->data("text/markdown"_L1));
        fragment = QTextDocumentFragment::fromMarkdown(s);
        hasData = true;
    } else
#endif
#ifndef QT_NO_TEXTHTMLPARSER
    if (source->hasFormat("application/x-qrichtext"_L1) && d->acceptRichText) {
        // x-qrichtext is always UTF-8 (taken from Qt3 since we don't use it anymore).
        const QString richtext = "<meta name=\"qrichtext\" content=\"1\" />"_L1
                + QString::fromUtf8(source->data("application/x-qrichtext"_L1));
        fragment = QTextDocumentFragment::fromHtml(richtext, d->doc);
        hasData = true;
    } else if (source->hasHtml() && d->acceptRichText) {
        fragment = QTextDocumentFragment::fromHtml(source->html(), d->doc);
        hasData = true;
    }
#endif // QT_NO_TEXTHTMLPARSER
    if (!hasData) {
        const QString text = source->text();
        if (!text.isNull()) {
            fragment = QTextDocumentFragment::fromPlainText(text);
            hasData = true;
        }
    }

    if (hasData)
        d->cursor.insertFragment(fragment);
    ensureCursorVisible();
}